

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogTestListener.cpp
# Opt level: O2

void __thiscall
rc::detail::LogTestListener::onTestCaseFinished(LogTestListener *this,CaseDescription *description)

{
  Type TVar1;
  ostream *poVar2;
  char *pcVar3;
  
  if (this->m_verboseProgress != true) {
    return;
  }
  TVar1 = (description->result).type;
  if (TVar1 == Discard) {
    poVar2 = this->m_out;
    pcVar3 = "x";
  }
  else {
    if (TVar1 == Failure) {
      poVar2 = std::endl<char,std::char_traits<char>>(this->m_out);
      std::operator<<(poVar2,"Found failure, shrinking");
      pcVar3 = "...";
      if (this->m_verboseShrinking != false) {
        pcVar3 = ":";
      }
      poVar2 = std::operator<<(this->m_out,pcVar3);
      std::endl<char,std::char_traits<char>>(poVar2);
      return;
    }
    if (TVar1 != Success) {
      return;
    }
    poVar2 = this->m_out;
    pcVar3 = ".";
  }
  std::operator<<(poVar2,pcVar3);
  return;
}

Assistant:

void LogTestListener::onTestCaseFinished(const CaseDescription &description) {
  if (!m_verboseProgress) {
    return;
  }

  switch (description.result.type) {
  case CaseResult::Type::Success:
    m_out << ".";
    break;
  case CaseResult::Type::Discard:
    m_out << "x";
    break;
  case CaseResult::Type::Failure:
    m_out << std::endl << "Found failure, shrinking";
    m_out << (m_verboseShrinking ? ":" : "...") << std::endl;
    break;
  }
}